

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsort.c
# Opt level: O0

sexp_conflict
sexp_sort_x(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict seq,sexp_conflict less,
           sexp_conflict key)

{
  int iVar1;
  long lVar2;
  sexp_conflict in_RCX;
  undefined8 in_RSI;
  sexp_conflict in_RDI;
  sexp_conflict in_R8;
  int *in_R9;
  sexp_gc_var_t __sexp_gc_preserver2;
  sexp_conflict scratch;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp_conflict vec;
  sexp_conflict res;
  sexp_sint_t len;
  sexp_conflict *in_stack_00000080;
  sexp_conflict *in_stack_00000088;
  sexp_conflict in_stack_00000090;
  sexp_conflict in_stack_000000a0;
  sexp_conflict local_80;
  sexp_gc_var_t local_78;
  sexp_conflict local_68;
  sexp_conflict *hi;
  sexp_gc_var_t *lo;
  sexp_conflict *in_stack_ffffffffffffffb8;
  sexp ctx_00;
  sexp_conflict local_8;
  
  memset(&stack0xffffffffffffffa0,0,0x10);
  local_68 = (sexp_conflict)0x43e;
  memset(&local_78,0,0x10);
  local_8 = in_RCX;
  if ((in_RCX != (sexp_conflict)0x23e) &&
     (in_RCX != (sexp_conflict)(((in_RDI->value).type.setters)->value).context.mark_stack[2].prev))
  {
    hi = (sexp_conflict *)&stack0xffffffffffffffb0;
    lo = (in_RDI->value).context.saves;
    (in_RDI->value).context.saves = (sexp_gc_var_t *)&stack0xffffffffffffffa0;
    local_78.var = &local_68;
    local_78.next = (in_RDI->value).context.saves;
    (in_RDI->value).context.saves = &local_78;
    lVar2 = sexp_listp_op(in_RDI,0,1,in_RCX);
    local_80 = in_RCX;
    if (lVar2 != 0x3e) {
      local_80 = (sexp_conflict)sexp_list_to_vector_op(in_RDI,0,1,in_RCX);
    }
    if ((((ulong)local_80 & 3) == 0) && (local_80->tag == 10)) {
      local_68 = (sexp_conflict)
                 sexp_make_vector_op(in_RDI,0,2,(local_80->value).stack.length << 1 | 1,0x43e);
      ctx_00 = (local_80->value).type.name;
      if ((in_R9 == (int *)0x3e) && (iVar1 = sexp_basic_comparator(in_R8), iVar1 != 0)) {
        sexp_merge_sort(ctx_00,in_stack_ffffffffffffffb8,(sexp_conflict *)local_80,(sexp_sint_t)lo,
                        (sexp_sint_t)hi);
        local_8 = local_80;
        if (((((ulong)in_R8 & 3) == 0) && (in_R8->tag == 0x1b)) &&
           ((in_R8->value).flonum_bits[0x5c] != '\0')) {
          sexp_vector_nreverse(in_RDI,local_80);
          local_8 = local_80;
        }
      }
      else if (((((ulong)in_R8 & 3) == 0) && (in_R8->tag == 0x14)) ||
              ((((ulong)in_R8 & 3) == 0 && (in_R8->tag == 0x1b)))) {
        if (((((ulong)in_R9 & 3) == 0) && (*in_R9 == 0x14)) ||
           (((((ulong)in_R9 & 3) == 0 && (*in_R9 == 0x1b)) || (in_R9 == (int *)0x3e)))) {
          local_8 = sexp_merge_sort_less
                              (in_stack_00000090,in_stack_00000088,in_stack_00000080,
                               (sexp_sint_t)ctx,(sexp_sint_t)self,(sexp_conflict)n,in_stack_000000a0
                              );
          if ((((ulong)local_8 & 3) != 0) || (local_8->tag != 0x13)) {
            local_8 = local_68;
          }
        }
        else {
          local_8 = (sexp_conflict)sexp_type_exception(in_RDI,in_RSI,0x14,in_R9);
        }
      }
      else {
        local_8 = (sexp_conflict)sexp_type_exception(in_RDI,in_RSI,0x14,in_R8);
      }
    }
    else {
      local_8 = (sexp_conflict)sexp_type_exception(in_RDI,in_RSI,10,local_80);
    }
    if (((((ulong)in_RCX & 3) == 0) && (in_RCX->tag == 6)) &&
       ((((ulong)local_8 & 3) != 0 || (local_8->tag != 0x13)))) {
      local_8 = sexp_vector_copy_to_list(in_RDI,local_80,in_RCX);
    }
    (in_RDI->value).context.saves = lo;
  }
  return local_8;
}

Assistant:

sexp sexp_sort_x (sexp ctx, sexp self, sexp_sint_t n, sexp seq,
                         sexp less, sexp key) {
  sexp_sint_t len;
  sexp res;
  sexp_gc_var2(vec, scratch);

  if (sexp_nullp(seq) || seq == sexp_global(ctx, SEXP_G_EMPTY_VECTOR))
    return seq;

  sexp_gc_preserve2(ctx, vec, scratch);

  vec = (sexp_truep(sexp_listp(ctx, seq)) ? sexp_list_to_vector(ctx, seq) : seq);

  if (! sexp_vectorp(vec)) {
    res = sexp_type_exception(ctx, self, SEXP_VECTOR, vec);
  } else {
    scratch = sexp_make_vector(ctx, sexp_make_fixnum(sexp_vector_length(vec)), SEXP_VOID);
    len = sexp_vector_length(vec);
    if (sexp_not(key) && sexp_basic_comparator(less)) {
      sexp_merge_sort(ctx, sexp_vector_data(vec), sexp_vector_data(scratch),
                      0, len-1);
      if (sexp_opcodep(less) && sexp_opcode_inverse(less))
        sexp_vector_nreverse(ctx, vec);
      res = vec;
    } else if (! (sexp_procedurep(less) || sexp_opcodep(less))) {
      res = sexp_type_exception(ctx, self, SEXP_PROCEDURE, less);
    } else if (! (sexp_procedurep(key) || sexp_opcodep(key) || sexp_not(key))) {
      res = sexp_type_exception(ctx, self, SEXP_PROCEDURE, key);
    } else {
      res = sexp_merge_sort_less(ctx, sexp_vector_data(vec),
                                 sexp_vector_data(scratch),
                                 0, len-1, less, key);
      if (!sexp_exceptionp(res))
        res = scratch;
    }
  }

  if (sexp_pairp(seq) && ! sexp_exceptionp(res))
    res = sexp_vector_copy_to_list(ctx, vec, seq);

  sexp_gc_release2(ctx);
  return res;
}